

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

VariablePortHeaderSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::VariablePortHeaderSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,DataTypeSyntax *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  VariablePortHeaderSyntax *pVVar16;
  
  pVVar16 = (VariablePortHeaderSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((VariablePortHeaderSyntax *)this->endPtr < pVVar16 + 1) {
    pVVar16 = (VariablePortHeaderSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pVVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pVVar16->super_PortHeaderSyntax).super_SyntaxNode.kind = VariablePortHeader;
  (pVVar16->super_PortHeaderSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pVVar16->super_PortHeaderSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pVVar16->constKeyword).kind = TVar4;
  (pVVar16->constKeyword).field_0x2 = uVar5;
  (pVVar16->constKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pVVar16->constKeyword).rawLen = uVar7;
  (pVVar16->constKeyword).info = pIVar1;
  (pVVar16->direction).kind = TVar8;
  (pVVar16->direction).field_0x2 = uVar9;
  (pVVar16->direction).numFlags = (NumericTokenFlags)NVar10.raw;
  (pVVar16->direction).rawLen = uVar11;
  (pVVar16->direction).info = pIVar2;
  (pVVar16->varKeyword).kind = TVar12;
  (pVVar16->varKeyword).field_0x2 = uVar13;
  (pVVar16->varKeyword).numFlags = (NumericTokenFlags)NVar14.raw;
  (pVVar16->varKeyword).rawLen = uVar15;
  (pVVar16->varKeyword).info = pIVar3;
  (pVVar16->dataType).ptr = args_3;
  (args_3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pVVar16;
  return pVVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }